

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<toml::value_t,_toml::error_info> *
toml::detail::guess_number_type<toml::type_config>
          (result<toml::value_t,_toml::error_info> *__return_storage_ptr__,location *first,
          context<toml::type_config> *ctx)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  uchar uVar2;
  byte bVar3;
  pointer puVar4;
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  undefined8 uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  size_t *psVar12;
  _Alloc_hider _Var13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  scanner_storage *other;
  scanner_storage *other_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  bool bVar16;
  initializer_list<unsigned_char> cs;
  source_location src;
  location loc;
  region int_reg;
  undefined1 local_1178 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1158;
  undefined4 local_1148;
  undefined4 uStack_1144;
  undefined4 uStack_1140;
  undefined4 uStack_113c;
  _Alloc_hider local_1138;
  undefined1 local_1130 [24];
  pointer local_1118;
  pointer pbStack_1110;
  pointer local_1108;
  result<toml::value_t,_toml::error_info> *local_1100;
  string local_10f8;
  location local_10d8;
  undefined1 local_1090 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1080 [2];
  pointer local_1060;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1028;
  undefined1 local_1020 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1010 [5];
  size_t *local_fb8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_fb0;
  string local_fa8;
  string local_f88;
  undefined1 local_f68 [32];
  pointer local_f48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f38;
  _Alloc_hider local_f28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f18;
  pointer local_f08 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ef8;
  _Alloc_hider local_ee8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ec8 [2];
  undefined1 local_eb8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ea8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e88 [2];
  undefined1 local_e78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e58;
  size_t *local_e48 [2];
  size_t local_e38 [2];
  undefined1 local_e28 [32];
  size_t *local_e08;
  size_t local_df8 [2];
  _Alloc_hider local_de8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_dd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_dc8 [2];
  undefined1 local_db8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_da8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d88 [2];
  undefined1 local_d78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d58;
  pointer local_d48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d38;
  undefined1 local_d28 [32];
  pointer local_d08;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_cf8;
  string local_ce8;
  string local_cc8;
  string local_ca8;
  string local_c88;
  string local_c68;
  string local_c48;
  string local_c28;
  string local_c08;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_be8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_be0;
  undefined4 local_bd8;
  undefined4 uStack_bd4;
  undefined4 uStack_bd0;
  undefined4 uStack_bcc;
  undefined4 local_bc8;
  undefined4 uStack_bc4;
  undefined4 uStack_bc0;
  undefined4 uStack_bbc;
  undefined4 local_bb8;
  undefined4 uStack_bb4;
  undefined4 uStack_bb0;
  undefined4 uStack_bac;
  _Alloc_hider local_ba8;
  size_t local_ba0;
  char local_b98 [16];
  pointer local_b88;
  pointer pbStack_b80;
  pointer local_b78;
  undefined1 local_b68 [32];
  undefined4 local_b48;
  undefined4 uStack_b44;
  undefined4 uStack_b40;
  undefined4 uStack_b3c;
  undefined4 local_b38;
  undefined4 uStack_b34;
  undefined4 uStack_b30;
  undefined4 uStack_b2c;
  _Alloc_hider local_b28;
  size_t local_b20;
  char local_b18 [16];
  pointer local_b08;
  pointer pbStack_b00;
  pointer local_af8;
  undefined1 local_ae8 [32];
  undefined4 local_ac8;
  undefined4 uStack_ac4;
  undefined4 uStack_ac0;
  undefined4 uStack_abc;
  undefined4 local_ab8;
  undefined4 uStack_ab4;
  undefined4 uStack_ab0;
  undefined4 uStack_aac;
  _Alloc_hider local_aa8;
  size_t local_aa0;
  char local_a98 [16];
  pointer local_a88;
  pointer pbStack_a80;
  pointer local_a78;
  undefined1 local_a68 [32];
  undefined4 local_a48;
  undefined4 uStack_a44;
  undefined4 uStack_a40;
  undefined4 uStack_a3c;
  undefined4 local_a38;
  undefined4 uStack_a34;
  undefined4 uStack_a30;
  undefined4 uStack_a2c;
  _Alloc_hider local_a28;
  size_t local_a20;
  char local_a18 [16];
  pointer local_a08;
  pointer pbStack_a00;
  pointer local_9f8;
  undefined1 local_9e8 [32];
  undefined4 local_9c8;
  undefined4 uStack_9c4;
  undefined4 uStack_9c0;
  undefined4 uStack_9bc;
  undefined4 local_9b8;
  undefined4 uStack_9b4;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  _Alloc_hider local_9a8;
  size_t local_9a0;
  char local_998 [16];
  pointer local_988;
  pointer pbStack_980;
  pointer local_978;
  undefined1 local_968 [32];
  undefined4 local_948;
  undefined4 uStack_944;
  undefined4 uStack_940;
  undefined4 uStack_93c;
  undefined4 local_938;
  undefined4 uStack_934;
  undefined4 uStack_930;
  undefined4 uStack_92c;
  _Alloc_hider local_928;
  size_t local_920;
  char local_918 [16];
  pointer local_908;
  pointer pbStack_900;
  pointer local_8f8;
  undefined1 local_8e8 [32];
  undefined4 local_8c8;
  undefined4 uStack_8c4;
  undefined4 uStack_8c0;
  undefined4 uStack_8bc;
  undefined4 local_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  _Alloc_hider local_8a8;
  size_t local_8a0;
  char local_898 [16];
  pointer local_888;
  pointer pbStack_880;
  pointer local_878;
  undefined1 local_868 [32];
  undefined4 local_848;
  undefined4 uStack_844;
  undefined4 uStack_840;
  undefined4 uStack_83c;
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  _Alloc_hider local_828;
  size_t local_820;
  char local_818 [16];
  pointer local_808;
  pointer pbStack_800;
  pointer local_7f8;
  undefined1 local_7e8 [32];
  undefined4 local_7c8;
  undefined4 uStack_7c4;
  undefined4 uStack_7c0;
  undefined4 uStack_7bc;
  undefined4 local_7b8;
  undefined4 uStack_7b4;
  undefined4 uStack_7b0;
  undefined4 uStack_7ac;
  _Alloc_hider local_7a8;
  size_t local_7a0;
  char local_798 [16];
  pointer local_788;
  pointer pbStack_780;
  pointer local_778;
  location local_768;
  location local_720;
  location local_6d8;
  location local_690;
  source_location local_648;
  source_location local_5d0;
  failure<toml::error_info> local_558;
  failure<toml::error_info> local_500;
  failure<toml::error_info> local_4a8;
  failure<toml::error_info> local_450;
  failure<toml::error_info> local_3f8;
  failure<toml::error_info> local_3a0;
  failure<toml::error_info> local_348;
  failure<toml::error_info> local_2f0;
  failure<toml::error_info> local_298;
  failure<toml::error_info> local_240;
  failure<toml::error_info> local_1e8;
  failure<toml::error_info> local_190;
  failure<toml::error_info> local_138;
  failure<toml::error_info> local_e0;
  failure<toml::error_info> local_88;
  
  location::location(&local_10d8,first);
  syntax::offset_datetime((sequence *)local_1090,&ctx->toml_spec_);
  sequence::scan((region *)local_1178,(sequence *)local_1090,&local_10d8);
  uVar7 = local_1178._0_8_;
  region::~region((region *)local_1178);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          (local_1090 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uVar7 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ_.value = offset_datetime;
    goto LAB_003c6f40;
  }
  local_10d8.source_.
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (first->source_).
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  this = &local_10d8.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount;
  p_Var1 = &(first->source_).
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)p_Var1);
  local_1028 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &first->source_name_;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &local_10d8.source_name_,local_1028);
  local_10d8.column_number_ = first->column_number_;
  local_10d8.location_ = first->location_;
  local_10d8.line_number_ = first->line_number_;
  syntax::local_datetime((sequence *)local_1090,&ctx->toml_spec_);
  sequence::scan((region *)local_1178,(sequence *)local_1090,&local_10d8);
  uVar7 = local_1178._0_8_;
  region::~region((region *)local_1178);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          (local_1090 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uVar7 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    puVar4 = ((local_10d8.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (((ulong)((long)((local_10d8.source_.
                         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4) <=
         local_10d8.location_) ||
       ((uVar2 = puVar4[local_10d8.location_], uVar2 != '-' && (uVar2 != '+')))) {
      __return_storage_ptr__->is_ok_ = true;
      (__return_storage_ptr__->field_1).succ_.value = local_datetime;
      goto LAB_003c6f40;
    }
    local_c08._M_dataplus._M_p = (pointer)&local_c08.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c08,"bad offset: must be [+-]HH:MM or Z","");
    syntax::time_offset((either *)local_1090,&ctx->toml_spec_);
    location::location(&local_690,&local_10d8);
    local_c28._M_dataplus._M_p = (pointer)&local_c28.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c28,"Hint: valid  : +09:00, -05:30\nHint: invalid: +9:00,  -5:30\n",
               "");
    make_syntax_error<toml::detail::either>
              ((error_info *)local_1178,&local_c08,(either *)local_1090,&local_690,&local_c28);
    err<toml::error_info>(&local_88,(error_info *)local_1178);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_88);
    failure<toml::error_info>::~failure(&local_88);
    if ((undefined1 *)CONCAT44(uStack_113c,uStack_1140) != local_1130) {
      operator_delete((undefined1 *)CONCAT44(uStack_113c,uStack_1140),local_1130._0_8_ + 1);
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_1158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1178._0_8_ != &local_1168) {
      operator_delete((void *)local_1178._0_8_,
                      CONCAT44(local_1168._M_allocated_capacity._4_4_,
                               local_1168._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c28._M_dataplus._M_p != &local_c28.field_2) {
      operator_delete(local_c28._M_dataplus._M_p,local_c28.field_2._M_allocated_capacity + 1);
    }
    location::~location(&local_690);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )(local_1090 + 8));
    _Var13._M_p = local_c08._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c08._M_dataplus._M_p == &local_c08.field_2) goto LAB_003c6f40;
    goto LAB_003c7a3f;
  }
  local_10d8.source_.
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (first->source_).
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)p_Var1);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &local_10d8.source_name_,local_1028);
  local_fb8 = &first->location_;
  local_10d8.column_number_ = first->column_number_;
  local_10d8.location_ = *local_fb8;
  local_10d8.line_number_ = first->line_number_;
  syntax::local_date((sequence *)local_1090,&ctx->toml_spec_);
  sequence::scan((region *)local_1178,(sequence *)local_1090,&local_10d8);
  uVar7 = local_1178._0_8_;
  region::~region((region *)local_1178);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          (local_1090 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uVar7 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    puVar4 = ((local_10d8.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = (long)((local_10d8.source_.
                     super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar4;
    if (uVar10 <= local_10d8.location_) goto LAB_003c7a4c;
    bVar3 = puVar4[local_10d8.location_];
    if ((bVar3 & 0xdf) == 0x54) {
      uVar11 = local_10d8.line_number_;
      if (local_10d8.location_ + 1 < uVar10) {
        local_10d8.column_number_ = local_10d8.column_number_ + 1;
        uVar10 = local_10d8.location_ + 1;
      }
      else {
        do {
          if (puVar4[local_10d8.location_] == '\n') {
            uVar11 = uVar11 + 1;
            local_10d8.column_number_ = 1;
            local_10d8.line_number_ = uVar11;
          }
          else {
            local_10d8.column_number_ = local_10d8.column_number_ + 1;
          }
          local_10d8.location_ = local_10d8.location_ + 1;
        } while (uVar10 != local_10d8.location_);
      }
      local_10d8.location_ = uVar10;
      local_c48._M_dataplus._M_p = (pointer)&local_c48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c48,"bad time: must be HH:MM:SS.subsec","");
      syntax::local_time((sequence *)local_1090,&ctx->toml_spec_);
      location::location(&local_6d8,&local_10d8);
      local_c68._M_dataplus._M_p = (pointer)&local_c68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c68,
                 "Hint: valid  : 1979-05-27T07:32:00, 1979-05-27 07:32:00.999999\nHint: invalid: 1979-05-27T7:32:00, 1979-05-27 17:32\n"
                 ,"");
      make_syntax_error<toml::detail::sequence>
                ((error_info *)local_1178,&local_c48,(sequence *)local_1090,&local_6d8,&local_c68);
      err<toml::error_info>(&local_e0,(error_info *)local_1178);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_e0);
      failure<toml::error_info>::~failure(&local_e0);
      if ((undefined1 *)CONCAT44(uStack_113c,uStack_1140) != local_1130) {
        operator_delete((undefined1 *)CONCAT44(uStack_113c,uStack_1140),local_1130._0_8_ + 1);
      }
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_1158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1178._0_8_ != &local_1168) {
        operator_delete((void *)local_1178._0_8_,
                        CONCAT44(local_1168._M_allocated_capacity._4_4_,
                                 local_1168._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c68._M_dataplus._M_p != &local_c68.field_2) {
        operator_delete(local_c68._M_dataplus._M_p,local_c68.field_2._M_allocated_capacity + 1);
      }
      location::~location(&local_6d8);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)(local_1090 + 8));
      local_c08.field_2._M_allocated_capacity = local_c48.field_2._M_allocated_capacity;
      _Var13._M_p = local_c48._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c48._M_dataplus._M_p == &local_c48.field_2) goto LAB_003c6f40;
    }
    else if (bVar3 == 0x20) {
      location::advance(&local_10d8,1);
      puVar4 = ((local_10d8.source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start;
      if (((ulong)((long)((local_10d8.source_.
                           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar4) <= local_10d8.location_)
         || (9 < (byte)(puVar4[local_10d8.location_] - 0x30))) {
LAB_003c7a4c:
        __return_storage_ptr__->is_ok_ = true;
        (__return_storage_ptr__->field_1).succ_.value = local_date;
        goto LAB_003c6f40;
      }
      local_c88._M_dataplus._M_p = (pointer)&local_c88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c88,"bad time: must be HH:MM:SS.subsec","");
      syntax::local_time((sequence *)local_1090,&ctx->toml_spec_);
      location::location(&local_720,&local_10d8);
      local_ca8._M_dataplus._M_p = (pointer)&local_ca8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_ca8,
                 "Hint: valid  : 1979-05-27T07:32:00, 1979-05-27 07:32:00.999999\nHint: invalid: 1979-05-27T7:32:00, 1979-05-27 17:32\n"
                 ,"");
      make_syntax_error<toml::detail::sequence>
                ((error_info *)local_1178,&local_c88,(sequence *)local_1090,&local_720,&local_ca8);
      err<toml::error_info>(&local_138,(error_info *)local_1178);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_138);
      failure<toml::error_info>::~failure(&local_138);
      error_info::~error_info((error_info *)local_1178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ca8._M_dataplus._M_p != &local_ca8.field_2) {
        operator_delete(local_ca8._M_dataplus._M_p,local_ca8.field_2._M_allocated_capacity + 1);
      }
      location::~location(&local_720);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)(local_1090 + 8));
      local_c08.field_2._M_allocated_capacity = local_c88.field_2._M_allocated_capacity;
      _Var13._M_p = local_c88._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c88._M_dataplus._M_p == &local_c88.field_2) goto LAB_003c6f40;
    }
    else {
      if (9 < (byte)(bVar3 - 0x30)) goto LAB_003c7a4c;
      local_cc8._M_dataplus._M_p = (pointer)&local_cc8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_cc8,"bad datetime: missing T or space","");
      local_1020._0_3_ = 0x207454;
      cs._M_len = 3;
      cs._M_array = local_1020;
      character_either::character_either((character_either *)local_1090,cs);
      location::location(&local_768,&local_10d8);
      local_ce8._M_dataplus._M_p = (pointer)&local_ce8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_ce8,
                 "Hint: valid  : 1979-05-27T07:32:00, 1979-05-27 07:32:00.999999\nHint: invalid: 1979-05-27T7:32:00, 1979-05-27 17:32\n"
                 ,"");
      make_syntax_error<toml::detail::character_either>
                ((error_info *)local_1178,&local_cc8,(character_either *)local_1090,&local_768,
                 &local_ce8);
      err<toml::error_info>(&local_190,(error_info *)local_1178);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_190);
      failure<toml::error_info>::~failure(&local_190);
      error_info::~error_info((error_info *)local_1178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ce8._M_dataplus._M_p != &local_ce8.field_2) {
        operator_delete(local_ce8._M_dataplus._M_p,local_ce8.field_2._M_allocated_capacity + 1);
      }
      location::~location(&local_768);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1090._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        operator_delete((void *)local_1090._8_8_,local_1080[0]._8_8_ - local_1090._8_8_);
      }
      local_c08.field_2._M_allocated_capacity = local_cc8.field_2._M_allocated_capacity;
      _Var13._M_p = local_cc8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cc8._M_dataplus._M_p == &local_cc8.field_2) goto LAB_003c6f40;
    }
LAB_003c7a3f:
    operator_delete(_Var13._M_p,local_c08.field_2._M_allocated_capacity + 1);
    goto LAB_003c6f40;
  }
  local_10d8.source_.
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (first->source_).
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)p_Var1);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &local_10d8.source_name_,local_1028);
  local_10d8.column_number_ = local_fb8[2];
  local_10d8.location_ = *local_fb8;
  local_10d8.line_number_ = local_fb8[1];
  syntax::local_time((sequence *)local_1090,&ctx->toml_spec_);
  sequence::scan((region *)local_1178,(sequence *)local_1090,&local_10d8);
  uVar7 = local_1178._0_8_;
  region::~region((region *)local_1178);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          (local_1090 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uVar7 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ_.value = local_time;
    goto LAB_003c6f40;
  }
  local_10d8.source_.
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (first->source_).
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)p_Var1);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &local_10d8.source_name_,local_1028);
  local_10d8.column_number_ = local_fb8[2];
  local_10d8.location_ = *local_fb8;
  local_10d8.line_number_ = local_fb8[1];
  local_1100 = __return_storage_ptr__;
  local_fb0 = p_Var1;
  syntax::floating((either *)local_1090,&ctx->toml_spec_);
  for (; local_1090._8_8_ != local_1080[0]._M_allocated_capacity;
      local_1090._8_8_ =
           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1090._8_8_)->_M_use_count) {
    _Var5._M_head_impl =
         (((unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
            *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1090._8_8_)->
               _vptr__Sp_counted_base)->_M_t).
         super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
         ._M_t.
         super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
         .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
    (*(_Var5._M_head_impl)->_vptr_scanner_base[2])(local_1178,_Var5._M_head_impl,&local_10d8);
    uVar7 = local_1178._0_8_;
    region::~region((region *)local_1178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)uVar7 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)(local_1090 + 8));
      __return_storage_ptr__ = local_1100;
      goto LAB_003c7a6b;
    }
  }
  region::region((region *)local_1178);
  p_Var1 = local_fb0;
  __return_storage_ptr__ = local_1100;
  uVar7 = local_1178._0_8_;
  region::~region((region *)local_1178);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          (local_1090 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uVar7 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
LAB_003c7a6b:
    puVar4 = ((local_10d8.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (((ulong)((long)((local_10d8.source_.
                         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4) <=
         local_10d8.location_) || (puVar4[local_10d8.location_] != '_')) {
LAB_003c7adc:
      __return_storage_ptr__->is_ok_ = true;
      (__return_storage_ptr__->field_1).succ_.value = floating;
      goto LAB_003c6f40;
    }
    if ((ctx->toml_spec_).ext_num_suffix == true) {
      syntax::num_suffix((sequence *)local_1090,&ctx->toml_spec_);
      sequence::scan((region *)local_1178,(sequence *)local_1090,&local_10d8);
      uVar7 = local_1178._0_8_;
      region::~region((region *)local_1178);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)(local_1090 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar7 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) goto LAB_003c7adc;
    }
    region::region((region *)local_1090,&local_10d8);
    source_location::source_location((source_location *)local_1178,(region *)local_1090);
    region::~region((region *)local_1090);
    local_d08 = (pointer)&local_cf8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d08,"bad float: `_` must be surrounded by digits","");
    local_7a8._M_p = local_798;
    local_7b8 = local_1148;
    uStack_7b4 = uStack_1144;
    uStack_7b0 = uStack_1140;
    uStack_7ac = uStack_113c;
    local_7c8 = local_1158._M_allocated_capacity._0_4_;
    uStack_7c4 = local_1158._M_allocated_capacity._4_4_;
    uStack_7c0 = local_1158._8_4_;
    uStack_7bc = local_1158._12_4_;
    local_7e8._16_4_ = local_1168._M_allocated_capacity._0_4_;
    local_7e8._20_4_ = local_1168._M_allocated_capacity._4_4_;
    local_7e8._24_4_ = local_1168._8_4_;
    local_7e8._28_4_ = local_1168._12_4_;
    local_7e8._0_8_ = local_1178._0_8_;
    local_7e8._8_8_ = local_1178._8_8_;
    if (local_1138._M_p == local_1130 + 8) {
      local_798[8] = local_1130[0x10];
      local_798[9] = local_1130[0x11];
      local_798[10] = local_1130[0x12];
      local_798[0xb] = local_1130[0x13];
      local_798[0xc] = local_1130[0x14];
      local_798[0xd] = local_1130[0x15];
      local_798[0xe] = local_1130[0x16];
      local_798[0xf] = local_1130[0x17];
    }
    else {
      local_7a8._M_p = local_1138._M_p;
    }
    local_7a0 = local_1130._0_8_;
    local_1130._0_8_ = 0;
    local_1130[8] = '\0';
    local_788 = local_1118;
    pbStack_780 = pbStack_1110;
    local_778 = local_1108;
    local_1118 = (pointer)0x0;
    pbStack_1110 = (pointer)0x0;
    local_1108 = (pointer)0x0;
    local_1138._M_p = local_1130 + 8;
    local_d28._0_8_ = local_d28 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"invalid underscore","");
    make_error_info<char_const(&)[105]>
              ((error_info *)local_1090,(toml *)&local_d08,(string *)local_7e8,
               (source_location *)local_d28,
               (string *)
               "Hint: valid  : +1.0, -2e-2, 3.141_592_653_589, inf, nan\nHint: invalid: .0, 1., _1.0, 1.0_, 1_.0, 1.0__0\n"
               ,(char (*) [105])in_R9);
    err<toml::error_info>(&local_1e8,(error_info *)local_1090);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_1e8);
    failure<toml::error_info>::~failure(&local_1e8);
    error_info::~error_info((error_info *)local_1090);
    if ((undefined1 *)local_d28._0_8_ != local_d28 + 0x10) {
      operator_delete((void *)local_d28._0_8_,local_d28._16_8_ + 1);
    }
    source_location::~source_location((source_location *)local_7e8);
    _Var13._M_p = (pointer)local_d08;
    if (local_d08 == (pointer)&local_cf8) goto LAB_003c8a95;
    goto LAB_003c8a8d;
  }
  local_10d8.source_.
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (first->source_).
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_10d8.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)p_Var1);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &local_10d8.source_name_,local_1028);
  local_10d8.column_number_ = local_fb8[2];
  local_10d8.location_ = *local_fb8;
  local_10d8.line_number_ = local_fb8[1];
  if ((ctx->toml_spec_).ext_hex_float == true) {
    syntax::hex_floating((sequence *)local_1090,&ctx->toml_spec_);
    sequence::scan((region *)local_1178,(sequence *)local_1090,&local_10d8);
    uVar7 = local_1178._0_8_;
    region::~region((region *)local_1178);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )(local_1090 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)uVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      location::operator=(&local_10d8,first);
      goto LAB_003c7baa;
    }
    puVar4 = ((local_10d8.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (((ulong)((long)((local_10d8.source_.
                         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4) <=
         local_10d8.location_) || (puVar4[local_10d8.location_] != '_')) goto LAB_003c7adc;
    if ((ctx->toml_spec_).ext_num_suffix == true) {
      syntax::num_suffix((sequence *)local_1090,&ctx->toml_spec_);
      sequence::scan((region *)local_1178,(sequence *)local_1090,&local_10d8);
      uVar7 = local_1178._0_8_;
      region::~region((region *)local_1178);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)(local_1090 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar7 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) goto LAB_003c7adc;
    }
    region::region((region *)local_1090,&local_10d8);
    source_location::source_location((source_location *)local_1178,(region *)local_1090);
    region::~region((region *)local_1090);
    local_d48[0] = (pointer)&local_d38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d48,"bad float: `_` must be surrounded by digits","");
    local_828._M_p = local_818;
    local_838 = local_1148;
    uStack_834 = uStack_1144;
    uStack_830 = uStack_1140;
    uStack_82c = uStack_113c;
    local_848 = local_1158._M_allocated_capacity._0_4_;
    uStack_844 = local_1158._M_allocated_capacity._4_4_;
    uStack_840 = local_1158._8_4_;
    uStack_83c = local_1158._12_4_;
    local_868._16_4_ = local_1168._M_allocated_capacity._0_4_;
    local_868._20_4_ = local_1168._M_allocated_capacity._4_4_;
    local_868._24_4_ = local_1168._8_4_;
    local_868._28_4_ = local_1168._12_4_;
    local_868._0_8_ = local_1178._0_8_;
    local_868._8_8_ = local_1178._8_8_;
    if (local_1138._M_p == local_1130 + 8) {
      local_818[8] = local_1130[0x10];
      local_818[9] = local_1130[0x11];
      local_818[10] = local_1130[0x12];
      local_818[0xb] = local_1130[0x13];
      local_818[0xc] = local_1130[0x14];
      local_818[0xd] = local_1130[0x15];
      local_818[0xe] = local_1130[0x16];
      local_818[0xf] = local_1130[0x17];
    }
    else {
      local_828._M_p = local_1138._M_p;
    }
    local_820 = local_1130._0_8_;
    local_1130._0_8_ = 0;
    local_1130[8] = '\0';
    local_808 = local_1118;
    pbStack_800 = pbStack_1110;
    local_7f8 = local_1108;
    local_1118 = (pointer)0x0;
    pbStack_1110 = (pointer)0x0;
    local_1108 = (pointer)0x0;
    local_1138._M_p = local_1130 + 8;
    local_d68._M_allocated_capacity = (size_type)&local_d58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d78)->
                field_2,"invalid underscore","");
    make_error_info<char_const(&)[105]>
              ((error_info *)local_1090,(toml *)local_d48,(string *)local_868,
               (source_location *)
               &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d78)->
                field_2,(string *)
                        "Hint: valid  : +1.0, -2e-2, 3.141_592_653_589, inf, nan\nHint: invalid: .0, 1., _1.0, 1.0_, 1_.0, 1.0__0\n"
               ,(char (*) [105])in_R9);
    err<toml::error_info>(&local_240,(error_info *)local_1090);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_240);
    failure<toml::error_info>::~failure(&local_240);
    error_info::~error_info((error_info *)local_1090);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d68._M_allocated_capacity != &local_d58) {
      operator_delete((void *)local_d68._M_allocated_capacity,local_d58._M_allocated_capacity + 1);
    }
    source_location::~source_location((source_location *)local_868);
    local_cf8._M_allocated_capacity = local_d38._M_allocated_capacity;
    _Var13._M_p = (pointer)local_d48[0];
    if (local_d48[0] != (pointer)&local_d38) goto LAB_003c8a8d;
    goto LAB_003c8a95;
  }
LAB_003c7baa:
  syntax::integer((either *)local_1178,&ctx->toml_spec_);
  p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           CONCAT44(local_1168._M_allocated_capacity._4_4_,local_1168._M_allocated_capacity._0_4_);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1178._8_8_ != p_Var6) {
    p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1178._8_8_;
    do {
      (**(code **)(*p_Var15->_vptr__Sp_counted_base + 0x10))
                ((region *)local_1090,p_Var15->_vptr__Sp_counted_base,&local_10d8);
      if ((_func_int **)local_1090._0_8_ != (_func_int **)0x0) goto LAB_003c7c0f;
      region::~region((region *)local_1090);
      p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&p_Var15->_M_use_count;
    } while (p_Var15 != p_Var6);
  }
  region::region((region *)local_1090);
LAB_003c7c0f:
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          (local_1178 + 8));
  __return_storage_ptr__ = local_1100;
  if ((_func_int **)local_1090._0_8_ == (_func_int **)0x0) {
    region::~region((region *)local_1090);
    __return_storage_ptr__ = local_1100;
    puVar4 = ((local_10d8.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (local_10d8.location_ <
        (ulong)((long)((local_10d8.source_.
                        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar4)) {
      uVar2 = puVar4[local_10d8.location_];
      if (uVar2 == '_') {
        region::region((region *)local_1090,&local_10d8);
        source_location::source_location((source_location *)local_1178,(region *)local_1090);
        region::~region((region *)local_1090);
        local_f48 = (pointer)&local_f38;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f48,"bad number: `_` must be surrounded by digits","");
        local_b28._M_p = local_b18;
        local_b38 = local_1148;
        uStack_b34 = uStack_1144;
        uStack_b30 = uStack_1140;
        uStack_b2c = uStack_113c;
        local_b48 = local_1158._M_allocated_capacity._0_4_;
        uStack_b44 = local_1158._M_allocated_capacity._4_4_;
        uStack_b40 = local_1158._8_4_;
        uStack_b3c = local_1158._12_4_;
        local_b68._16_4_ = local_1168._M_allocated_capacity._0_4_;
        local_b68._20_4_ = local_1168._M_allocated_capacity._4_4_;
        local_b68._24_4_ = local_1168._8_4_;
        local_b68._28_4_ = local_1168._12_4_;
        local_b68._0_8_ = local_1178._0_8_;
        local_b68._8_8_ = local_1178._8_8_;
        if (local_1138._M_p == local_1130 + 8) {
          local_b18[8] = local_1130[0x10];
          local_b18[9] = local_1130[0x11];
          local_b18[10] = local_1130[0x12];
          local_b18[0xb] = local_1130[0x13];
          local_b18[0xc] = local_1130[0x14];
          local_b18[0xd] = local_1130[0x15];
          local_b18[0xe] = local_1130[0x16];
          local_b18[0xf] = local_1130[0x17];
        }
        else {
          local_b28._M_p = local_1138._M_p;
        }
        local_b20 = local_1130._0_8_;
        local_1130._0_8_ = 0;
        local_1130[8] = '\0';
        local_b08 = local_1118;
        pbStack_b00 = pbStack_1110;
        local_af8 = local_1108;
        local_1118 = (pointer)0x0;
        pbStack_1110 = (pointer)0x0;
        local_1108 = (pointer)0x0;
        local_1138._M_p = local_1130 + 8;
        local_f68._0_8_ = local_f68 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_f68,"digits required before `_`","");
        local_1020._0_8_ = local_1010;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1020,
                   "Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\nHint: invalid: _42, 1__000, 0123\n"
                   ,"");
        make_error_info<std::__cxx11::string>
                  ((error_info *)local_1090,(toml *)&local_f48,(string *)local_b68,
                   (source_location *)local_f68,(string *)local_1020,in_R9);
        err<toml::error_info>(&local_500,(error_info *)local_1090);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_500)
        ;
        failure<toml::error_info>::~failure(&local_500);
        error_info::~error_info((error_info *)local_1090);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1020._0_8_ != local_1010) {
          operator_delete((void *)local_1020._0_8_,(ulong)(local_1010[0]._M_allocated_capacity + 1))
          ;
        }
        if ((undefined1 *)local_f68._0_8_ != local_f68 + 0x10) {
          operator_delete((void *)local_f68._0_8_,local_f68._16_8_ + 1);
        }
        source_location::~source_location((source_location *)local_b68);
        local_cf8._M_allocated_capacity = local_f38._M_allocated_capacity;
        _Var13._M_p = (pointer)local_f48;
        if (local_f48 != (pointer)&local_f38) goto LAB_003c8a8d;
      }
      else {
        if (uVar2 != '.') goto LAB_003c7ed6;
        region::region((region *)local_1090,&local_10d8);
        source_location::source_location((source_location *)local_1178,(region *)local_1090);
        region::~region((region *)local_1090);
        local_f08[0] = (pointer)&local_ef8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_f08,"bad float: integer part is required before decimal point",""
                  );
        local_aa8._M_p = local_a98;
        local_ab8 = local_1148;
        uStack_ab4 = uStack_1144;
        uStack_ab0 = uStack_1140;
        uStack_aac = uStack_113c;
        local_ac8 = local_1158._M_allocated_capacity._0_4_;
        uStack_ac4 = local_1158._M_allocated_capacity._4_4_;
        uStack_ac0 = local_1158._8_4_;
        uStack_abc = local_1158._12_4_;
        local_ae8._16_4_ = local_1168._M_allocated_capacity._0_4_;
        local_ae8._20_4_ = local_1168._M_allocated_capacity._4_4_;
        local_ae8._24_4_ = local_1168._8_4_;
        local_ae8._28_4_ = local_1168._12_4_;
        local_ae8._0_8_ = local_1178._0_8_;
        local_ae8._8_8_ = local_1178._8_8_;
        if (local_1138._M_p == local_1130 + 8) {
          local_a98[8] = local_1130[0x10];
          local_a98[9] = local_1130[0x11];
          local_a98[10] = local_1130[0x12];
          local_a98[0xb] = local_1130[0x13];
          local_a98[0xc] = local_1130[0x14];
          local_a98[0xd] = local_1130[0x15];
          local_a98[0xe] = local_1130[0x16];
          local_a98[0xf] = local_1130[0x17];
        }
        else {
          local_aa8._M_p = local_1138._M_p;
        }
        local_aa0 = local_1130._0_8_;
        local_1130._0_8_ = 0;
        local_1130[8] = '\0';
        local_a88 = local_1118;
        pbStack_a80 = pbStack_1110;
        local_a78 = local_1108;
        local_1118 = (pointer)0x0;
        pbStack_1110 = (pointer)0x0;
        local_1108 = (pointer)0x0;
        local_1138._M_p = local_1130 + 8;
        local_f28._M_p = (pointer)&local_f18;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f28,"missing integer part","");
        local_1020._0_8_ = local_1010;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1020,
                   "Hint: valid  : +1.0, -2e-2, 3.141_592_653_589, inf, nan\nHint: invalid: .0, 1., _1.0, 1.0_, 1_.0, 1.0__0\n"
                   ,"");
        make_error_info<std::__cxx11::string>
                  ((error_info *)local_1090,(toml *)local_f08,(string *)local_ae8,
                   (source_location *)&local_f28,(string *)local_1020,in_R9);
        err<toml::error_info>(&local_4a8,(error_info *)local_1090);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_4a8)
        ;
        failure<toml::error_info>::~failure(&local_4a8);
        error_info::~error_info((error_info *)local_1090);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1020._0_8_ != local_1010) {
          operator_delete((void *)local_1020._0_8_,(ulong)(local_1010[0]._M_allocated_capacity + 1))
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f28._M_p != &local_f18) {
          operator_delete(local_f28._M_p,local_f18._M_allocated_capacity + 1);
        }
        source_location::~source_location((source_location *)local_ae8);
        local_cf8._M_allocated_capacity = local_ef8._M_allocated_capacity;
        _Var13._M_p = (pointer)local_f08[0];
        if (local_f08[0] != (pointer)&local_ef8) goto LAB_003c8a8d;
      }
    }
    else {
LAB_003c7ed6:
      region::region((region *)local_1090,&local_10d8);
      source_location::source_location((source_location *)local_1178,(region *)local_1090);
      region::~region((region *)local_1090);
      local_f88._M_dataplus._M_p = (pointer)&local_f88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f88,"bad format: unknown value appeared","");
      local_ba8._M_p = local_b98;
      local_bb8 = local_1148;
      uStack_bb4 = uStack_1144;
      uStack_bb0 = uStack_1140;
      uStack_bac = uStack_113c;
      local_bc8 = local_1158._M_allocated_capacity._0_4_;
      uStack_bc4 = local_1158._M_allocated_capacity._4_4_;
      uStack_bc0 = local_1158._8_4_;
      uStack_bbc = local_1158._12_4_;
      local_bd8 = local_1168._M_allocated_capacity._0_4_;
      uStack_bd4 = local_1168._M_allocated_capacity._4_4_;
      uStack_bd0 = local_1168._8_4_;
      uStack_bcc = local_1168._12_4_;
      local_be8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1178._0_8_;
      p_Stack_be0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1178._8_8_;
      if (local_1138._M_p == local_1130 + 8) {
        local_b98[8] = local_1130[0x10];
        local_b98[9] = local_1130[0x11];
        local_b98[10] = local_1130[0x12];
        local_b98[0xb] = local_1130[0x13];
        local_b98[0xc] = local_1130[0x14];
        local_b98[0xd] = local_1130[0x15];
        local_b98[0xe] = local_1130[0x16];
        local_b98[0xf] = local_1130[0x17];
      }
      else {
        local_ba8._M_p = local_1138._M_p;
      }
      local_ba0 = local_1130._0_8_;
      local_1130._0_8_ = 0;
      local_1130[8] = '\0';
      local_b88 = local_1118;
      pbStack_b80 = pbStack_1110;
      local_b78 = local_1108;
      local_1118 = (pointer)0x0;
      pbStack_1110 = (pointer)0x0;
      local_1108 = (pointer)0x0;
      local_1138._M_p = local_1130 + 8;
      local_fa8._M_dataplus._M_p = (pointer)&local_fa8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_fa8,"here","");
      make_error_info<>((error_info *)local_1090,&local_f88,(source_location *)&local_be8,&local_fa8
                       );
      err<toml::error_info>(&local_558,(error_info *)local_1090);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_558);
      failure<toml::error_info>::~failure(&local_558);
      error_info::~error_info((error_info *)local_1090);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_fa8._M_dataplus._M_p != &local_fa8.field_2) {
        operator_delete(local_fa8._M_dataplus._M_p,local_fa8.field_2._M_allocated_capacity + 1);
      }
      source_location::~source_location((source_location *)&local_be8);
      local_cf8._M_allocated_capacity = local_f88.field_2._M_allocated_capacity;
      _Var13._M_p = local_f88._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f88._M_dataplus._M_p != &local_f88.field_2) {
LAB_003c8a8d:
        operator_delete(_Var13._M_p,local_cf8._M_allocated_capacity + 1);
      }
    }
LAB_003c8a95:
    source_location::~source_location((source_location *)local_1178);
    goto LAB_003c6f40;
  }
  puVar4 = ((local_10d8.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (local_10d8.location_ <
      (ulong)((long)((local_10d8.source_.
                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar4)) {
    bVar3 = puVar4[local_10d8.location_];
    if (bVar3 == 0x5f) {
      if ((ctx->toml_spec_).ext_num_suffix == true) {
        syntax::num_suffix((sequence *)local_1020,&ctx->toml_spec_);
        sequence::scan((region *)local_1178,(sequence *)local_1020,&local_10d8);
        uVar7 = local_1178._0_8_;
        region::~region((region *)local_1178);
        std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
        ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                 *)(local_1020 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar7 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) goto LAB_003c7cab;
      }
      if (local_1060 < (pointer)0x3) {
        region::as_string_abi_cxx11_((string *)local_1178,(region *)local_1090);
        iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1178,"0");
        if (iVar8 == 0) {
          bVar16 = true;
        }
        else {
          region::as_string_abi_cxx11_((string *)local_1020,(region *)local_1090);
          iVar8 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1020,"-0");
          if (iVar8 == 0) {
            bVar16 = true;
          }
          else {
            region::as_string_abi_cxx11_(&local_10f8,(region *)local_1090);
            iVar8 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_10f8,"+0");
            bVar16 = iVar8 == 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_10f8._M_dataplus._M_p != &local_10f8.field_2) {
              operator_delete(local_10f8._M_dataplus._M_p,
                              local_10f8.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1020._0_8_ != local_1010) {
            operator_delete((void *)local_1020._0_8_,
                            (ulong)(local_1010[0]._M_allocated_capacity + 1));
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1178._0_8_ != &local_1168) {
          operator_delete((void *)local_1178._0_8_,
                          CONCAT44(local_1168._M_allocated_capacity._4_4_,
                                   local_1168._M_allocated_capacity._0_4_) + 1);
        }
        __return_storage_ptr__ = local_1100;
        if (bVar16) {
          region::region((region *)local_1020,&local_10d8);
          source_location::source_location((source_location *)local_1178,(region *)local_1020);
          region::~region((region *)local_1020);
          local_d88[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d78;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d88,"bad integer: leading zero is not allowed in decimal int",
                     "");
          local_8a8._M_p = local_898;
          local_8b8 = local_1148;
          uStack_8b4 = uStack_1144;
          uStack_8b0 = uStack_1140;
          uStack_8ac = uStack_113c;
          local_8c8 = local_1158._M_allocated_capacity._0_4_;
          uStack_8c4 = local_1158._M_allocated_capacity._4_4_;
          uStack_8c0 = local_1158._8_4_;
          uStack_8bc = local_1158._12_4_;
          local_8e8._16_4_ = local_1168._M_allocated_capacity._0_4_;
          local_8e8._20_4_ = local_1168._M_allocated_capacity._4_4_;
          local_8e8._24_4_ = local_1168._8_4_;
          local_8e8._28_4_ = local_1168._12_4_;
          local_8e8._0_8_ = local_1178._0_8_;
          local_8e8._8_8_ = local_1178._8_8_;
          if (local_1138._M_p == local_1130 + 8) {
            local_898[8] = local_1130[0x10];
            local_898[9] = local_1130[0x11];
            local_898[10] = local_1130[0x12];
            local_898[0xb] = local_1130[0x13];
            local_898[0xc] = local_1130[0x14];
            local_898[0xd] = local_1130[0x15];
            local_898[0xe] = local_1130[0x16];
            local_898[0xf] = local_1130[0x17];
          }
          else {
            local_8a8._M_p = local_1138._M_p;
          }
          local_8a0 = local_1130._0_8_;
          local_1130._0_8_ = 0;
          local_1130[8] = '\0';
          local_888 = local_1118;
          pbStack_880 = pbStack_1110;
          local_878 = local_1108;
          local_1118 = (pointer)0x0;
          pbStack_1110 = (pointer)0x0;
          local_1108 = (pointer)0x0;
          local_1138._M_p = local_1130 + 8;
          local_da8._M_allocated_capacity = (size_type)&local_d98;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_db8)->field_2,"leading zero","");
          make_error_info<char_const(&)[96]>
                    ((error_info *)local_1020,(toml *)local_d88,(string *)local_8e8,
                     (source_location *)
                     &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_db8)->field_2,
                     (string *)
                     "Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\nHint: invalid: _42, 1__000, 0123\n"
                     ,(char (*) [96])in_R9);
          err<toml::error_info>(&local_298,(error_info *)local_1020);
          local_1100->is_ok_ = false;
          failure<toml::error_info>::failure
                    ((failure<toml::error_info> *)&(local_1100->field_1).succ_,&local_298);
          failure<toml::error_info>::~failure(&local_298);
          error_info::~error_info((error_info *)local_1020);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_da8._M_allocated_capacity != &local_d98) {
            operator_delete((void *)local_da8._M_allocated_capacity,
                            local_d98._M_allocated_capacity + 1);
          }
          source_location::~source_location((source_location *)local_8e8);
          pbVar14 = local_d88[0];
          if (local_d88[0] !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d78) {
LAB_003c916f:
            operator_delete(pbVar14,(ulong)(local_d78._0_8_ + 1));
          }
LAB_003c9177:
          source_location::~source_location((source_location *)local_1178);
          __return_storage_ptr__ = local_1100;
          goto LAB_003c9184;
        }
      }
      region::region((region *)local_1020,&local_10d8);
      source_location::source_location((source_location *)local_1178,(region *)local_1020);
      region::~region((region *)local_1020);
      local_dc8[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_db8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_dc8,"bad integer: `_` must be surrounded by digits","");
      local_928._M_p = local_918;
      local_938 = local_1148;
      uStack_934 = uStack_1144;
      uStack_930 = uStack_1140;
      uStack_92c = uStack_113c;
      local_948 = local_1158._M_allocated_capacity._0_4_;
      uStack_944 = local_1158._M_allocated_capacity._4_4_;
      uStack_940 = local_1158._8_4_;
      uStack_93c = local_1158._12_4_;
      local_968._16_4_ = local_1168._M_allocated_capacity._0_4_;
      local_968._20_4_ = local_1168._M_allocated_capacity._4_4_;
      local_968._24_4_ = local_1168._8_4_;
      local_968._28_4_ = local_1168._12_4_;
      local_968._0_8_ = local_1178._0_8_;
      local_968._8_8_ = local_1178._8_8_;
      if (local_1138._M_p == local_1130 + 8) {
        local_918[8] = local_1130[0x10];
        local_918[9] = local_1130[0x11];
        local_918[10] = local_1130[0x12];
        local_918[0xb] = local_1130[0x13];
        local_918[0xc] = local_1130[0x14];
        local_918[0xd] = local_1130[0x15];
        local_918[0xe] = local_1130[0x16];
        local_918[0xf] = local_1130[0x17];
      }
      else {
        local_928._M_p = local_1138._M_p;
      }
      local_920 = local_1130._0_8_;
      local_1130._0_8_ = 0;
      local_1130[8] = '\0';
      local_908 = local_1118;
      pbStack_900 = pbStack_1110;
      local_8f8 = local_1108;
      local_1118 = (pointer)0x0;
      pbStack_1110 = (pointer)0x0;
      local_1108 = (pointer)0x0;
      local_1138._M_p = local_1130 + 8;
      local_de8._M_p = (pointer)&local_dd8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_de8,"invalid underscore","");
      make_error_info<char_const(&)[96]>
                ((error_info *)local_1020,(toml *)local_dc8,(string *)local_968,
                 (source_location *)&local_de8,
                 (string *)
                 "Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\nHint: invalid: _42, 1__000, 0123\n"
                 ,(char (*) [96])in_R9);
      err<toml::error_info>(&local_2f0,(error_info *)local_1020);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_2f0);
      failure<toml::error_info>::~failure(&local_2f0);
      error_info::~error_info((error_info *)local_1020);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_de8._M_p != &local_dd8) {
        operator_delete(local_de8._M_p,local_dd8._M_allocated_capacity + 1);
      }
      source_location::~source_location((source_location *)local_968);
      pbVar14 = local_dc8[0];
      if (local_dc8[0] !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_db8) {
LAB_003c8ed2:
        operator_delete(pbVar14,(ulong)((long)&(((pointer)local_db8._0_8_)->_M_dataplus)._M_p + 1));
      }
LAB_003c8eda:
      source_location::~source_location((source_location *)local_1178);
      goto LAB_003c9184;
    }
    if (9 < (byte)(bVar3 - 0x30)) {
      uVar9 = bVar3 - 0x2d;
      if (uVar9 < 0x39) {
        if ((0x100000001000002U >> ((ulong)uVar9 & 0x3f) & 1) != 0) {
          region::region((region *)local_1020,&local_10d8);
          source_location::source_location((source_location *)local_1178,(region *)local_1020);
          region::~region((region *)local_1020);
          local_ec8[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_eb8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_ec8,"bad float: invalid format","");
          local_a28._M_p = local_a18;
          local_a38 = local_1148;
          uStack_a34 = uStack_1144;
          uStack_a30 = uStack_1140;
          uStack_a2c = uStack_113c;
          local_a48 = local_1158._M_allocated_capacity._0_4_;
          uStack_a44 = local_1158._M_allocated_capacity._4_4_;
          uStack_a40 = local_1158._8_4_;
          uStack_a3c = local_1158._12_4_;
          local_a68._16_4_ = local_1168._M_allocated_capacity._0_4_;
          local_a68._20_4_ = local_1168._M_allocated_capacity._4_4_;
          local_a68._24_4_ = local_1168._8_4_;
          local_a68._28_4_ = local_1168._12_4_;
          local_a68._0_8_ = local_1178._0_8_;
          local_a68._8_8_ = local_1178._8_8_;
          if (local_1138._M_p == local_1130 + 8) {
            local_a18[8] = local_1130[0x10];
            local_a18[9] = local_1130[0x11];
            local_a18[10] = local_1130[0x12];
            local_a18[0xb] = local_1130[0x13];
            local_a18[0xc] = local_1130[0x14];
            local_a18[0xd] = local_1130[0x15];
            local_a18[0xe] = local_1130[0x16];
            local_a18[0xf] = local_1130[0x17];
          }
          else {
            local_a28._M_p = local_1138._M_p;
          }
          local_a20 = local_1130._0_8_;
          local_1130._0_8_ = 0;
          local_1130[8] = '\0';
          local_a08 = local_1118;
          pbStack_a00 = pbStack_1110;
          local_9f8 = local_1108;
          local_1118 = (pointer)0x0;
          pbStack_1110 = (pointer)0x0;
          local_1108 = (pointer)0x0;
          local_1138._M_p = local_1130 + 8;
          local_ee8._M_p = (pointer)&local_ed8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_ee8,"here","");
          local_10f8._M_dataplus._M_p = (pointer)&local_10f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_10f8,
                     "Hint: valid  : +1.0, -2e-2, 3.141_592_653_589, inf, nan\nHint: invalid: .0, 1., _1.0, 1.0_, 1_.0, 1.0__0\n"
                     ,"");
          make_error_info<std::__cxx11::string>
                    ((error_info *)local_1020,(toml *)local_ec8,(string *)local_a68,
                     (source_location *)&local_ee8,&local_10f8,in_R9);
          err<toml::error_info>(&local_450,(error_info *)local_1020);
          __return_storage_ptr__->is_ok_ = false;
          failure<toml::error_info>::failure
                    ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                     &local_450);
          failure<toml::error_info>::~failure(&local_450);
          error_info::~error_info((error_info *)local_1020);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_10f8._M_dataplus._M_p != &local_10f8.field_2) {
            operator_delete(local_10f8._M_dataplus._M_p,local_10f8.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_ee8._M_p != &local_ed8) {
            operator_delete(local_ee8._M_p,local_ed8._M_allocated_capacity + 1);
          }
          source_location::~source_location((source_location *)local_a68);
          local_db8._0_8_ = local_eb8._0_8_;
          pbVar14 = local_ec8[0];
          if (local_ec8[0] !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_eb8)
          goto LAB_003c8ed2;
          goto LAB_003c8eda;
        }
        if ((0x2001UL >> ((ulong)uVar9 & 0x3f) & 1) != 0) {
          region::region((region *)local_1020,&local_10d8);
          source_location::source_location((source_location *)local_1178,(region *)local_1020);
          region::~region((region *)local_1020);
          local_e88[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e78;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_e88,"bad datetime: invalid format","");
          local_9a8._M_p = local_998;
          local_9b8 = local_1148;
          uStack_9b4 = uStack_1144;
          uStack_9b0 = uStack_1140;
          uStack_9ac = uStack_113c;
          local_9c8 = local_1158._M_allocated_capacity._0_4_;
          uStack_9c4 = local_1158._M_allocated_capacity._4_4_;
          uStack_9c0 = local_1158._8_4_;
          uStack_9bc = local_1158._12_4_;
          local_9e8._16_4_ = local_1168._M_allocated_capacity._0_4_;
          local_9e8._20_4_ = local_1168._M_allocated_capacity._4_4_;
          local_9e8._24_4_ = local_1168._8_4_;
          local_9e8._28_4_ = local_1168._12_4_;
          local_9e8._0_8_ = local_1178._0_8_;
          local_9e8._8_8_ = local_1178._8_8_;
          if (local_1138._M_p == local_1130 + 8) {
            local_998[8] = local_1130[0x10];
            local_998[9] = local_1130[0x11];
            local_998[10] = local_1130[0x12];
            local_998[0xb] = local_1130[0x13];
            local_998[0xc] = local_1130[0x14];
            local_998[0xd] = local_1130[0x15];
            local_998[0xe] = local_1130[0x16];
            local_998[0xf] = local_1130[0x17];
          }
          else {
            local_9a8._M_p = local_1138._M_p;
          }
          local_9a0 = local_1130._0_8_;
          local_1130._0_8_ = 0;
          local_1130[8] = '\0';
          local_988 = local_1118;
          pbStack_980 = pbStack_1110;
          local_978 = local_1108;
          local_1118 = (pointer)0x0;
          pbStack_1110 = (pointer)0x0;
          local_1108 = (pointer)0x0;
          local_1138._M_p = local_1130 + 8;
          local_ea8._M_allocated_capacity = (size_type)&local_e98;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_eb8)->field_2,"here","");
          local_10f8._M_dataplus._M_p = (pointer)&local_10f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_10f8,
                     "Hint: valid  : 1979-05-27T07:32:00-07:00, 1979-05-27 07:32:00.999999Z\nHint: invalid: 1979-05-27T7:32:00-7:00, 1979-05-27 7:32-00:30"
                     ,"");
          make_error_info<std::__cxx11::string>
                    ((error_info *)local_1020,(toml *)local_e88,(string *)local_9e8,
                     (source_location *)
                     &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_eb8)->field_2,&local_10f8,in_R9);
          err<toml::error_info>(&local_3f8,(error_info *)local_1020);
          local_1100->is_ok_ = false;
          failure<toml::error_info>::failure
                    ((failure<toml::error_info> *)&(local_1100->field_1).succ_,&local_3f8);
          failure<toml::error_info>::~failure(&local_3f8);
          error_info::~error_info((error_info *)local_1020);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_10f8._M_dataplus._M_p != &local_10f8.field_2) {
            operator_delete(local_10f8._M_dataplus._M_p,local_10f8.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_ea8._M_allocated_capacity != &local_e98) {
            operator_delete((void *)local_ea8._M_allocated_capacity,
                            local_e98._M_allocated_capacity + 1);
          }
          source_location::~source_location((source_location *)local_9e8);
          local_d78._0_8_ = local_e78._0_8_;
          pbVar14 = local_e88[0];
          if (local_e88[0] !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e78)
          goto LAB_003c916f;
          goto LAB_003c9177;
        }
      }
      goto LAB_003c7cab;
    }
    if (bVar3 == 0x30) {
      location::retrace(&local_10d8);
      local_e08 = local_df8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e08,"bad integer: leading zero","");
      region::region((region *)local_1178,&local_10d8);
      source_location::source_location(&local_5d0,(region *)local_1178);
      local_e28._0_8_ = (_Alloc_hider *)(local_e28 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e28,"leading zero is not allowed","");
      local_10f8._M_dataplus._M_p = (pointer)&local_10f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_10f8,
                 "Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\nHint: invalid: _42, 1__000, 0123\n"
                 ,"");
      make_error_info<std::__cxx11::string>
                ((error_info *)local_1020,(toml *)&local_e08,(string *)&local_5d0,
                 (source_location *)local_e28,&local_10f8,in_R9);
      err<toml::error_info>(&local_348,(error_info *)local_1020);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_348);
      failure<toml::error_info>::~failure(&local_348);
      error_info::~error_info((error_info *)local_1020);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10f8._M_dataplus._M_p != &local_10f8.field_2) {
        operator_delete(local_10f8._M_dataplus._M_p,local_10f8.field_2._M_allocated_capacity + 1);
      }
      if ((_Alloc_hider *)local_e28._0_8_ != (_Alloc_hider *)(local_e28 + 0x10)) {
        operator_delete((void *)local_e28._0_8_,(ulong)(local_e28._16_8_ + 1));
      }
      source_location::~source_location(&local_5d0);
      region::~region((region *)local_1178);
      local_e38[0] = local_df8[0];
      psVar12 = local_e08;
      if (local_e08 != local_df8) {
LAB_003c85d9:
        operator_delete(psVar12,local_e38[0] + 1);
      }
    }
    else {
      local_e48[0] = local_e38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e48,"bad integer: invalid digit after an integer","");
      region::region((region *)local_1178,&local_10d8);
      source_location::source_location(&local_648,(region *)local_1178);
      local_e68._M_allocated_capacity = (size_type)&local_e58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_e78 + 0x10),"this digit is not allowed","");
      local_10f8._M_dataplus._M_p = (pointer)&local_10f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_10f8,
                 "Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\nHint: invalid: _42, 1__000, 0123\n"
                 ,"");
      make_error_info<std::__cxx11::string>
                ((error_info *)local_1020,(toml *)local_e48,(string *)&local_648,
                 (source_location *)(local_e78 + 0x10),&local_10f8,in_R9);
      err<toml::error_info>(&local_3a0,(error_info *)local_1020);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_3a0);
      failure<toml::error_info>::~failure(&local_3a0);
      error_info::~error_info((error_info *)local_1020);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10f8._M_dataplus._M_p != &local_10f8.field_2) {
        operator_delete(local_10f8._M_dataplus._M_p,local_10f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e68._M_allocated_capacity != &local_e58) {
        operator_delete((void *)local_e68._M_allocated_capacity,local_e58._M_allocated_capacity + 1)
        ;
      }
      source_location::~source_location(&local_648);
      region::~region((region *)local_1178);
      psVar12 = local_e48[0];
      if (local_e48[0] != local_e38) goto LAB_003c85d9;
    }
  }
  else {
LAB_003c7cab:
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ_.value = integer;
  }
LAB_003c9184:
  region::~region((region *)local_1090);
LAB_003c6f40:
  location::~location(&local_10d8);
  return __return_storage_ptr__;
}

Assistant:

result<value_t, error_info>
guess_number_type(const location& first, const context<TC>& ctx)
{
    const auto& spec = ctx.toml_spec();
    location loc = first;

    if(syntax::offset_datetime(spec).scan(loc).is_ok())
    {
        return ok(value_t::offset_datetime);
    }
    loc = first;

    if(syntax::local_datetime(spec).scan(loc).is_ok())
    {
        const auto curr = loc.current();
        // if offset_datetime contains bad offset, it syntax::offset_datetime
        // fails to scan it.
        if(curr == '+' || curr == '-')
        {
            return err(make_syntax_error("bad offset: must be [+-]HH:MM or Z",
                syntax::time_offset(spec), loc, std::string(
                "Hint: valid  : +09:00, -05:30\n"
                "Hint: invalid: +9:00,  -5:30\n")));
        }
        return ok(value_t::local_datetime);
    }
    loc = first;

    if(syntax::local_date(spec).scan(loc).is_ok())
    {
        // bad time may appear after this.

        if( ! loc.eof())
        {
            const auto c = loc.current();
            if(c == 'T' || c == 't')
            {
                loc.advance();

                return err(make_syntax_error("bad time: must be HH:MM:SS.subsec",
                    syntax::local_time(spec), loc, std::string(
                    "Hint: valid  : 1979-05-27T07:32:00, 1979-05-27 07:32:00.999999\n"
                    "Hint: invalid: 1979-05-27T7:32:00, 1979-05-27 17:32\n")));
            }
            if(c == ' ')
            {
                // A space is allowed as a delimiter between local time.
                // But there is a case where bad time follows a space.
                // - invalid: 2019-06-16 7:00:00
                // - valid  : 2019-06-16 07:00:00
                loc.advance();
                if( ! loc.eof() && ('0' <= loc.current() && loc.current() <= '9'))
                {
                    return err(make_syntax_error("bad time: must be HH:MM:SS.subsec",
                        syntax::local_time(spec), loc, std::string(
                        "Hint: valid  : 1979-05-27T07:32:00, 1979-05-27 07:32:00.999999\n"
                        "Hint: invalid: 1979-05-27T7:32:00, 1979-05-27 17:32\n")));
                }
            }
            if('0' <= c && c <= '9')
            {
                return err(make_syntax_error("bad datetime: missing T or space",
                    character_either{'T', 't', ' '}, loc, std::string(
                    "Hint: valid  : 1979-05-27T07:32:00, 1979-05-27 07:32:00.999999\n"
                    "Hint: invalid: 1979-05-27T7:32:00, 1979-05-27 17:32\n")));
            }
        }
        return ok(value_t::local_date);
    }
    loc = first;

    if(syntax::local_time(spec).scan(loc).is_ok())
    {
        return ok(value_t::local_time);
    }
    loc = first;

    if(syntax::floating(spec).scan(loc).is_ok())
    {
        if( ! loc.eof() && loc.current() == '_')
        {
            if(spec.ext_num_suffix && syntax::num_suffix(spec).scan(loc).is_ok())
            {
                return ok(value_t::floating);
            }
            auto src = source_location(region(loc));
            return err(make_error_info(
                "bad float: `_` must be surrounded by digits",
                std::move(src), "invalid underscore",
                "Hint: valid  : +1.0, -2e-2, 3.141_592_653_589, inf, nan\n"
                "Hint: invalid: .0, 1., _1.0, 1.0_, 1_.0, 1.0__0\n"));
        }
        return ok(value_t::floating);
    }
    loc = first;

    if(spec.ext_hex_float)
    {
        if(syntax::hex_floating(spec).scan(loc).is_ok())
        {
            if( ! loc.eof() && loc.current() == '_')
            {
                if(spec.ext_num_suffix && syntax::num_suffix(spec).scan(loc).is_ok())
                {
                    return ok(value_t::floating);
                }
                auto src = source_location(region(loc));
                return err(make_error_info(
                    "bad float: `_` must be surrounded by digits",
                    std::move(src), "invalid underscore",
                    "Hint: valid  : +1.0, -2e-2, 3.141_592_653_589, inf, nan\n"
                    "Hint: invalid: .0, 1., _1.0, 1.0_, 1_.0, 1.0__0\n"));
            }
            return ok(value_t::floating);
        }
        loc = first;
    }

    if(auto int_reg = syntax::integer(spec).scan(loc))
    {
        if( ! loc.eof())
        {
            const auto c = loc.current();
            if(c == '_')
            {
                if(spec.ext_num_suffix && syntax::num_suffix(spec).scan(loc).is_ok())
                {
                    return ok(value_t::integer);
                }

                if(int_reg.length() <= 2 && (int_reg.as_string() == "0" ||
                    int_reg.as_string() == "-0" || int_reg.as_string() == "+0"))
                {
                    auto src = source_location(region(loc));
                    return err(make_error_info(
                        "bad integer: leading zero is not allowed in decimal int",
                        std::move(src), "leading zero",
                        "Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\n"
                        "Hint: invalid: _42, 1__000, 0123\n"));
                }
                else
                {
                    auto src = source_location(region(loc));
                    return err(make_error_info(
                        "bad integer: `_` must be surrounded by digits",
                        std::move(src), "invalid underscore",
                        "Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\n"
                        "Hint: invalid: _42, 1__000, 0123\n"));
                }
            }
            if('0' <= c && c <= '9')
            {
                if(loc.current() == '0')
                {
                    loc.retrace();
                    return err(make_error_info(
                        "bad integer: leading zero",
                        source_location(region(loc)), "leading zero is not allowed",
                        std::string("Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\n"
                                    "Hint: invalid: _42, 1__000, 0123\n")
                        ));
                }
                else // invalid digits, especially in oct/bin ints.
                {
                    return err(make_error_info(
                        "bad integer: invalid digit after an integer",
                        source_location(region(loc)), "this digit is not allowed",
                        std::string("Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\n"
                                    "Hint: invalid: _42, 1__000, 0123\n")
                        ));
                }
            }
            if(c == ':' || c == '-')
            {
                auto src = source_location(region(loc));
                return err(make_error_info("bad datetime: invalid format",
                    std::move(src), "here",
                    std::string("Hint: valid  : 1979-05-27T07:32:00-07:00, 1979-05-27 07:32:00.999999Z\n"
                                "Hint: invalid: 1979-05-27T7:32:00-7:00, 1979-05-27 7:32-00:30")
                    ));
            }
            if(c == '.' || c == 'e' || c == 'E')
            {
                auto src = source_location(region(loc));
                return err(make_error_info("bad float: invalid format",
                    std::move(src), "here", std::string(
                    "Hint: valid  : +1.0, -2e-2, 3.141_592_653_589, inf, nan\n"
                    "Hint: invalid: .0, 1., _1.0, 1.0_, 1_.0, 1.0__0\n")));
            }
        }
        return ok(value_t::integer);
    }
    if( ! loc.eof() && loc.current() == '.')
    {
        auto src = source_location(region(loc));
        return err(make_error_info("bad float: integer part is required before decimal point",
            std::move(src), "missing integer part", std::string(
            "Hint: valid  : +1.0, -2e-2, 3.141_592_653_589, inf, nan\n"
            "Hint: invalid: .0, 1., _1.0, 1.0_, 1_.0, 1.0__0\n")
            ));
    }
    if( ! loc.eof() && loc.current() == '_')
    {
        auto src = source_location(region(loc));
        return err(make_error_info("bad number: `_` must be surrounded by digits",
            std::move(src), "digits required before `_`", std::string(
            "Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\n"
            "Hint: invalid: _42, 1__000, 0123\n")
            ));
    }

    auto src = source_location(region(loc));
    return err(make_error_info("bad format: unknown value appeared",
                std::move(src), "here"));
}